

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChException.h
# Opt level: O0

void __thiscall chrono::ChException::ChException(ChException *this,string *swhat)

{
  string *swhat_local;
  ChException *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__ChException_0012f928;
  std::__cxx11::string::string((string *)&this->m_swhat,(string *)swhat);
  return;
}

Assistant:

ChException(std::string swhat) : m_swhat(swhat){}